

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

void __thiscall QPDF::decryptString(QPDF *this,string *str,QPDFObjGen og)

{
  size_type *psVar1;
  size_t len;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  uchar *puVar3;
  RC4_KEY *key_00;
  QPDFObjGen og_00;
  pointer *__ptr;
  byte bVar4;
  uchar *in_R8;
  Pl_Buffer bufpl;
  string key;
  Pl_AES_PDF pl;
  string local_188;
  undefined1 local_168 [56];
  QPDFObjGen local_130;
  __uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  string local_118 [2];
  Pl_AES_PDF local_d8;
  
  if (og.obj == 0) {
    return;
  }
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_128._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       *(tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_> *)
        &((_Var2._M_head_impl)->encp).
         super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
  local_130 = og;
  if (*(int *)((long)&(((Members *)
                       local_128._M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log).
                      super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) < 4) {
switchD_0020a273_caseD_2:
    bVar4 = 0;
  }
  else {
    switch(*(undefined4 *)
            ((long)&(((Members *)
                     local_128._M_t.
                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->tokenizer).val.
                    field_2 + 0xc)) {
    case 0:
      goto switchD_0020a273_caseD_0;
    default:
      local_168._0_8_ = local_168 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,
                 "unknown encryption filter for strings (check /StrF in /Encrypt dictionary); strings may be decrypted improperly"
                 ,"");
      damagedPDF((QPDFExc *)&local_d8,this,(string *)local_168);
      warn(this,(QPDFExc *)&local_d8);
      QPDFExc::~QPDFExc((QPDFExc *)&local_d8);
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      }
      _Var2._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_128._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
           (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
           ((_Var2._M_head_impl)->encp).
           super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(undefined4 *)
       ((long)&(((Members *)
                local_128._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->tokenizer).val.field_2
       + 0xc) = 3;
    case 3:
    case 4:
      bVar4 = 1;
      break;
    case 2:
      goto switchD_0020a273_caseD_2;
    }
  }
  local_120 = ((_Var2._M_head_impl)->encp).
              super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_120->_M_use_count = local_120->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_120->_M_use_count = local_120->_M_use_count + 1;
    }
  }
  og_00._1_7_ = 0;
  og_00.obj._0_1_ = bVar4;
  getKeyForObject_abi_cxx11_
            (local_118,(QPDF *)&local_128,(shared_ptr<QPDF::EncryptionParameters> *)local_130,og_00,
             SUB81(in_R8,0));
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  if (bVar4 == 0) {
    len = str->_M_string_length;
    QUtil::make_unique_cstr((QUtil *)&local_188,str);
    key_00 = (RC4_KEY *)QUtil::unsigned_char_pointer(local_118);
    if ((local_118[0]._M_string_length & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(local_118[0]._M_string_length);
    }
    RC4::RC4((RC4 *)local_168,key_00,local_118[0]._M_string_length & 0xffffffff,(uchar *)og_00,in_R8
            );
    puVar3 = QUtil::unsigned_char_pointer(local_188._M_dataplus._M_p);
    RC4::process((RC4 *)local_168,puVar3,len,puVar3);
    psVar1 = &local_d8.super_Pipeline.identifier._M_string_length;
    local_d8.super_Pipeline._vptr_Pipeline = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,local_188._M_dataplus._M_p,local_188._M_dataplus._M_p + len);
    std::__cxx11::string::operator=((string *)str,(string *)&local_d8);
    if (local_d8.super_Pipeline._vptr_Pipeline != (_func_int **)psVar1) {
      operator_delete(local_d8.super_Pipeline._vptr_Pipeline,
                      local_d8.super_Pipeline.identifier._M_string_length + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    }
    if (local_188._M_dataplus._M_p != (char *)0x0) {
      operator_delete__(local_188._M_dataplus._M_p);
    }
  }
  else {
    Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_168,"decrypted string",(Pipeline *)0x0);
    puVar3 = QUtil::unsigned_char_pointer(local_118);
    Pl_AES_PDF::Pl_AES_PDF
              (&local_d8,"aes decrypt string",(Pipeline *)local_168,false,puVar3,
               local_118[0]._M_string_length);
    Pipeline::writeString(&local_d8.super_Pipeline,str);
    Pl_AES_PDF::finish(&local_d8);
    Pl_Buffer::getString_abi_cxx11_(&local_188,(Pl_Buffer *)local_168);
    std::__cxx11::string::operator=((string *)str,(string *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    Pl_AES_PDF::~Pl_AES_PDF(&local_d8);
    Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_168);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
    operator_delete(local_118[0]._M_dataplus._M_p,local_118[0].field_2._M_allocated_capacity + 1);
  }
switchD_0020a273_caseD_0:
  return;
}

Assistant:

void
QPDF::decryptString(std::string& str, QPDFObjGen og)
{
    if (!og.isIndirect()) {
        return;
    }
    bool use_aes = false;
    if (m->encp->encryption_V >= 4) {
        switch (m->encp->cf_string) {
        case e_none:
            return;

        case e_aes:
            use_aes = true;
            break;

        case e_aesv3:
            use_aes = true;
            break;

        case e_rc4:
            break;

        default:
            warn(damagedPDF(
                "unknown encryption filter for strings (check /StrF in "
                "/Encrypt dictionary); strings may be decrypted improperly"));
            // To avoid repeated warnings, reset cf_string.  Assume we'd want to use AES if V == 4.
            m->encp->cf_string = e_aes;
            use_aes = true;
            break;
        }
    }

    std::string key = getKeyForObject(m->encp, og, use_aes);
    try {
        if (use_aes) {
            QTC::TC("qpdf", "QPDF_encryption aes decode string");
            Pl_Buffer bufpl("decrypted string");
            Pl_AES_PDF pl(
                "aes decrypt string",
                &bufpl,
                false,
                QUtil::unsigned_char_pointer(key),
                key.length());
            pl.writeString(str);
            pl.finish();
            str = bufpl.getString();
        } else {
            QTC::TC("qpdf", "QPDF_encryption rc4 decode string");
            size_t vlen = str.length();
            // Using std::shared_ptr guarantees that tmp will be freed even if rc4.process throws an
            // exception.
            auto tmp = QUtil::make_unique_cstr(str);
            RC4 rc4(QUtil::unsigned_char_pointer(key), toI(key.length()));
            auto data = QUtil::unsigned_char_pointer(tmp.get());
            rc4.process(data, vlen, data);
            str = std::string(tmp.get(), vlen);
        }
    } catch (QPDFExc&) {
        throw;
    } catch (std::runtime_error& e) {
        throw damagedPDF("error decrypting string for object " + og.unparse() + ": " + e.what());
    }
}